

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O3

bool __thiscall xray_re::xr_skl_motion::save_skl(xr_skl_motion *this,char *path)

{
  bool bVar1;
  xr_memory_writer *this_00;
  
  this_00 = (xr_memory_writer *)operator_new(0x2078);
  xr_memory_writer::xr_memory_writer(this_00);
  xr_writer::open_chunk((xr_writer *)this_00,0x1200);
  (*(this->super_xr_motion)._vptr_xr_motion[3])(this,this_00);
  xr_writer::close_chunk((xr_writer *)this_00);
  bVar1 = xr_memory_writer::save_to(this_00,path);
  (*(this_00->super_xr_writer)._vptr_xr_writer[1])(this_00);
  return bVar1;
}

Assistant:

bool xr_skl_motion::save_skl(const char* path) const
{
	xr_memory_writer* w = new xr_memory_writer();
	w->open_chunk(EOBJ_CHUNK_SMOTION);
	save(*w);
	w->close_chunk();
	bool status = w->save_to(path);
	delete w;
	return status;
}